

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

void * Curl_hash_pick(Curl_hash *h,void *key,size_t key_len)

{
  Curl_llist_element *pCVar1;
  size_t sVar2;
  void *pvVar3;
  Curl_llist *pCVar4;
  
  pCVar4 = h->table;
  if (pCVar4 == (Curl_llist *)0x0) {
    pvVar3 = (void *)0x0;
  }
  else {
    sVar2 = (*h->hash_func)(key,key_len,(long)h->slots);
    pCVar4 = pCVar4 + sVar2;
    do {
      pCVar1 = pCVar4->head;
      if (pCVar1 == (Curl_llist_element *)0x0) {
        return (void *)0x0;
      }
      pvVar3 = pCVar1->ptr;
      sVar2 = (*h->comp_func)((void *)((long)pvVar3 + 0x28),*(size_t *)((long)pvVar3 + 0x20),key,
                              key_len);
      pCVar4 = (Curl_llist *)&pCVar1->next;
    } while (sVar2 == 0);
    pvVar3 = *(void **)((long)pvVar3 + 0x18);
  }
  return pvVar3;
}

Assistant:

void *
Curl_hash_pick(struct Curl_hash *h, void *key, size_t key_len)
{
  struct Curl_llist_element *le;
  struct Curl_llist *l;

  DEBUGASSERT(h);
  if(h->table) {
    DEBUGASSERT(h->slots);
    l = FETCH_LIST(h, key, key_len);
    for(le = l->head; le; le = le->next) {
      struct Curl_hash_element *he = le->ptr;
      if(h->comp_func(he->key, he->key_len, key, key_len)) {
        return he->ptr;
      }
    }
  }

  return NULL;
}